

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

ExprP<tcu::Matrix<float,_4,_3>_> __thiscall
vkt::shaderexecutor::exprP<tcu::Matrix<float,4,3>>
          (shaderexecutor *this,
          SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_4,_3>_>_> *ptr)

{
  deInt32 *pdVar1;
  int *piVar2;
  SharedPtrStateBase *pSVar3;
  SharedPtrStateBase *in_RDX;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  ExprP<tcu::Matrix<float,_4,_3>_> EVar4;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  pSVar3 = *(SharedPtrStateBase **)(this + 8);
  if (pSVar3 != ptr->m_state) {
    if (pSVar3 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar3->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        *(undefined8 *)this = 0;
        (**(code **)(**(long **)(this + 8) + 0x10))();
        in_RDX = extraout_RDX;
      }
      LOCK();
      piVar2 = (int *)(*(long *)(this + 8) + 0xc);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(this + 8) != (long *)0x0) {
          (**(code **)(**(long **)(this + 8) + 8))();
          in_RDX = extraout_RDX_00;
        }
        *(undefined8 *)(this + 8) = 0;
      }
    }
    *(Expr<tcu::Matrix<float,_4,_3>_> **)this = ptr->m_ptr;
    pSVar3 = ptr->m_state;
    *(SharedPtrStateBase **)(this + 8) = pSVar3;
    if (pSVar3 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
      UNLOCK();
      LOCK();
      *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
      UNLOCK();
    }
  }
  EVar4.super_ContainerExprPBase<tcu::Matrix<float,_4,_3>_>.
  super_ExprPBase<tcu::Matrix<float,_4,_3>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_4,_3>_>_>.m_state = in_RDX;
  EVar4.super_ContainerExprPBase<tcu::Matrix<float,_4,_3>_>.
  super_ExprPBase<tcu::Matrix<float,_4,_3>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_4,_3>_>_>.m_ptr =
       (Expr<tcu::Matrix<float,_4,_3>_> *)this;
  return (ExprP<tcu::Matrix<float,_4,_3>_>)
         EVar4.super_ContainerExprPBase<tcu::Matrix<float,_4,_3>_>.
         super_ExprPBase<tcu::Matrix<float,_4,_3>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_4,_3>_>_>;
}

Assistant:

ExprP<T> exprP (const SharedPtr<const Expr<T> >& ptr)
{
	ExprP<T> ret;
	static_cast<SharedPtr<const Expr<T> >&>(ret) = ptr;
	return ret;
}